

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

bool helics::haltTimer(activeProtector *active,steady_timer *tickTimer)

{
  conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
  cVar1;
  pair<bool,_bool> *ppVar2;
  size_t sVar3;
  conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void> res;
  int timerLoopCount;
  size_t cancelled;
  handle protector;
  bool TimerRunning;
  guarded<std::pair<bool,_bool>,_std::mutex> *in_stack_ffffffffffffff88;
  lock_handle<std::pair<bool,_bool>,_std::mutex> *this;
  undefined2 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9b;
  int in_stack_ffffffffffffff9c;
  duration<long,std::ratio<1l,1000l>> local_60 [12];
  int local_54;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_ffffffffffffffb0;
  mutex_type *in_stack_ffffffffffffffd0;
  bool local_19;
  
  gmlc::libguarded::guarded<std::pair<bool,_bool>,_std::mutex>::lock(in_stack_ffffffffffffff88);
  ppVar2 = gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::operator->
                     ((lock_handle<std::pair<bool,_bool>,_std::mutex> *)&stack0xffffffffffffffc8);
  if ((ppVar2->second & 1U) == 0) {
    local_19 = false;
  }
  else {
    this = (lock_handle<std::pair<bool,_bool>,_std::mutex> *)&stack0xffffffffffffffc8;
    ppVar2 = gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::operator->(this);
    ppVar2->first = false;
    gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::unlock(this);
    sVar3 = asio::
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
            ::cancel(in_stack_ffffffffffffffb0);
    local_19 = sVar3 != 0;
  }
  gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::~lock_handle
            ((lock_handle<std::pair<bool,_bool>,_std::mutex> *)0x51d426);
  local_54 = 0;
  do {
    if (local_19 == false) {
      return true;
    }
    if (local_54 % 4 == 3) {
      in_stack_ffffffffffffff9c = 0x28;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                (local_60,(int *)&stack0xffffffffffffff9c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffd0);
    }
    else {
      std::this_thread::yield();
    }
    cVar1 = gmlc::libguarded::guarded<std::pair<bool,_bool>,_std::mutex>::load
                      ((guarded<std::pair<bool,_bool>,_std::mutex> *)
                       CONCAT44(in_stack_ffffffffffffff9c,
                                CONCAT13(in_stack_ffffffffffffff9b,
                                         CONCAT12(in_stack_ffffffffffffff9a,
                                                  in_stack_ffffffffffffff98))));
    in_stack_ffffffffffffff9a = cVar1.first;
    in_stack_ffffffffffffff9b = cVar1.second;
    local_19 = (bool)(in_stack_ffffffffffffff9b & 1);
    local_54 = local_54 + 1;
  } while (local_54 != 100);
  return false;
}

Assistant:

static bool haltTimer(activeProtector& active, asio::steady_timer& tickTimer)
{
    bool TimerRunning = true;
    {
        auto protector = active.lock();
        if (protector->second) {
            protector->first = false;
            protector.unlock();
            auto cancelled = tickTimer.cancel();
            if (cancelled == 0) {
                TimerRunning = false;
            }
        } else {
            TimerRunning = false;
        }
    }
    int timerLoopCount = 0;
    while (TimerRunning) {
        if (timerLoopCount % 4 != 3) {
            std::this_thread::yield();
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(40));
        }
        auto res = active.load();
        TimerRunning = res.second;
        ++timerLoopCount;
        if (timerLoopCount == 100) {
            // assume the timer was never started so just exit and hope it doesn't somehow get
            // called later and generate a seg fault.
            return false;
        }
    }
    return true;
}